

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserStatus xmlCtxtGetStatus(xmlParserCtxt *ctxt)

{
  xmlParserStatus xVar1;
  int iVar2;
  xmlParserStatus local_1c;
  xmlParserStatus bits;
  xmlParserCtxt *ctxt_local;
  
  iVar2 = xmlCtxtIsCatastrophicError(ctxt);
  if (iVar2 == 0) {
    local_1c = (xmlParserStatus)(ctxt->wellFormed == 0);
    if (ctxt->nsWellFormed == 0) {
      local_1c = local_1c | XML_STATUS_NOT_NS_WELL_FORMED;
    }
    if ((ctxt->validate != 0) && (ctxt->valid == 0)) {
      local_1c = local_1c | XML_STATUS_DTD_VALIDATION_FAILED;
    }
    ctxt_local._4_4_ = local_1c;
  }
  else {
    local_1c = XML_STATUS_CATASTROPHIC_ERROR|XML_STATUS_NOT_NS_WELL_FORMED|
               XML_STATUS_NOT_WELL_FORMED;
    xVar1 = XML_STATUS_CATASTROPHIC_ERROR|XML_STATUS_NOT_NS_WELL_FORMED|XML_STATUS_NOT_WELL_FORMED;
    if ((ctxt != (xmlParserCtxt *)0x0) && (xVar1 = local_1c, ctxt->validate != 0)) {
      xVar1 = XML_STATUS_CATASTROPHIC_ERROR|XML_STATUS_DTD_VALIDATION_FAILED|
              XML_STATUS_NOT_NS_WELL_FORMED|XML_STATUS_NOT_WELL_FORMED;
    }
    local_1c = xVar1;
    ctxt_local._4_4_ = local_1c;
  }
  return ctxt_local._4_4_;
}

Assistant:

xmlParserStatus
xmlCtxtGetStatus(xmlParserCtxt *ctxt) {
    xmlParserStatus bits = 0;

    if (xmlCtxtIsCatastrophicError(ctxt)) {
        bits |= XML_STATUS_CATASTROPHIC_ERROR |
                XML_STATUS_NOT_WELL_FORMED |
                XML_STATUS_NOT_NS_WELL_FORMED;
        if ((ctxt != NULL) && (ctxt->validate))
            bits |= XML_STATUS_DTD_VALIDATION_FAILED;

        return(bits);
    }

    if (!ctxt->wellFormed)
        bits |= XML_STATUS_NOT_WELL_FORMED;
    if (!ctxt->nsWellFormed)
        bits |= XML_STATUS_NOT_NS_WELL_FORMED;
    if ((ctxt->validate) && (!ctxt->valid))
        bits |= XML_STATUS_DTD_VALIDATION_FAILED;

    return(bits);
}